

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O3

void __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::Forward
          (RecursiveMaximumLikelihoodParameterGeneration *this)

{
  ulong __new_size;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_02;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_03;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  pointer pdVar8;
  pointer pvVar9;
  pointer pvVar10;
  pointer pvVar11;
  pointer pvVar12;
  pointer pvVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  pointer pvVar18;
  pointer pvVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  size_type __new_size_00;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  size_type sVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double dVar43;
  long local_120;
  ulong local_c0;
  ulong local_b0;
  
  uVar36 = (int)((long)(this->window_coefficients_).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->window_coefficients_).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  iVar2 = this->num_order_;
  __new_size = (long)iVar2 + 1;
  iVar20 = (int)__new_size * uVar36;
  this_00 = &(this->buffer_).stored_dynamic_mean_vectors;
  __new_size_00 = (size_type)iVar20;
  if ((((long)(this->buffer_).stored_dynamic_mean_vectors.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).stored_dynamic_mean_vectors.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size_00
       != 0) &&
     (std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_00,__new_size_00), 0 < iVar20)) {
    lVar39 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).stored_dynamic_mean_vectors.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar39),(long)this->calculation_field_);
      lVar39 = lVar39 + 0x18;
    } while (__new_size_00 * 0x18 != lVar39);
  }
  this_01 = &(this->buffer_).stored_dynamic_diagonal_covariance_matrices;
  if ((((long)(this->buffer_).stored_dynamic_diagonal_covariance_matrices.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).stored_dynamic_diagonal_covariance_matrices.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size_00
       != 0) &&
     (std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_01,__new_size_00), 0 < iVar20)) {
    lVar39 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).stored_dynamic_diagonal_covariance_matrices.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar39),(long)this->calculation_field_);
      lVar39 = lVar39 + 0x18;
    } while (__new_size_00 * 0x18 != lVar39);
  }
  if ((((long)(this->buffer_).pi.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).pi.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size !=
       0) && (std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::resize(&(this->buffer_).pi,__new_size), -1 < iVar2)) {
    lVar39 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).pi.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar39),(long)this->calculation_field_);
      lVar39 = lVar39 + 0x18;
    } while ((__new_size & 0xffffffff) * 0x18 != lVar39);
  }
  if ((((long)(this->buffer_).k.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).k.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size !=
       0) && (std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::resize(&(this->buffer_).k,__new_size), -1 < iVar2)) {
    lVar39 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).k.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar39),(long)this->calculation_field_);
      lVar39 = lVar39 + 0x18;
    } while ((__new_size & 0xffffffff) * 0x18 != lVar39);
  }
  this_02 = &(this->buffer_).p;
  if ((((long)(this->buffer_).p.
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).p.
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size !=
       0) && (std::
              vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              ::resize(this_02,__new_size), -1 < iVar2)) {
    uVar17 = (ulong)(uint)this->calculation_field_;
    uVar24 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this->buffer_).p.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar24,(long)(int)uVar17);
      uVar17 = (ulong)(uint)this->calculation_field_;
      if (0 < this->calculation_field_) {
        lVar39 = *(long *)&(this_02->
                           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar24].
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        lVar27 = 0;
        lVar40 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)(lVar39 + lVar27),
                     (long)((int)uVar17 * 2 + 1));
          lVar39 = *(long *)&(this_02->
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar24].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          pvVar6 = *(void **)(lVar39 + lVar27);
          pvVar7 = *(void **)(lVar39 + 8 + lVar27);
          if (pvVar6 != pvVar7) {
            memset(pvVar6,0,((long)pvVar7 + (-8 - (long)pvVar6) & 0xfffffffffffffff8U) + 8);
          }
          uVar17 = (ulong)this->calculation_field_;
          *(undefined8 *)((long)pvVar6 + uVar17 * 8) = 0x7fefffffffffffff;
          lVar40 = lVar40 + 1;
          lVar27 = lVar27 + 0x18;
        } while (lVar40 < (long)uVar17);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != (__new_size & 0xffffffff));
  }
  this_03 = &(this->buffer_).c;
  if ((((long)(this->buffer_).c.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).c.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size !=
       0) && (std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::resize(this_03,__new_size), -1 < iVar2)) {
    pvVar19 = (this->buffer_).c.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar39 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar39),(long)this->calculation_field_);
      pvVar19 = (this->buffer_).c.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = *(void **)((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar39);
      pvVar7 = *(void **)((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar39 + 8);
      if (pvVar6 != pvVar7) {
        memset(pvVar6,0,((long)pvVar7 + (-8 - (long)pvVar6) & 0xfffffffffffffff8U) + 8);
      }
      lVar39 = lVar39 + 0x18;
    } while ((__new_size & 0xffffffff) * 0x18 != lVar39);
  }
  iVar3 = this->calculation_field_;
  iVar4 = this->current_frame_;
  uVar5 = this->num_past_frame_;
  iVar25 = ~uVar5 + iVar3;
  pdVar8 = (this->buffer_).static_and_dynamic_parameters.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar39 = (long)((iVar4 + iVar25) % iVar3);
  if (-1 < iVar2) {
    pvVar19 = (this_03->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar17 = 0;
    do {
      *(double *)
       (*(long *)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data + lVar39 * 8) = pdVar8[uVar17];
      uVar17 = uVar17 + 1;
      pvVar19 = pvVar19 + 1;
    } while ((__new_size & 0xffffffff) != uVar17);
  }
  lVar27 = (long)iVar3;
  if (0 < iVar20) {
    pvVar19 = (this_00->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    sVar31 = 0;
    do {
      *(double *)
       (*(long *)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data + lVar39 * 8) = pdVar8[__new_size + sVar31];
      sVar31 = sVar31 + 1;
      pvVar19 = pvVar19 + 1;
    } while (__new_size_00 != sVar31);
  }
  iVar21 = iVar20 + (int)__new_size;
  if (-1 < iVar2) {
    pvVar18 = (this_02->
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar40 = 0;
    do {
      lVar26 = *(long *)((long)&(pvVar18->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data + lVar40);
      pvVar6 = *(void **)(lVar26 + lVar39 * 0x18);
      pvVar7 = *(void **)(lVar26 + 8 + lVar39 * 0x18);
      if (pvVar6 != pvVar7) {
        memset(pvVar6,0,((long)pvVar7 + (-8 - (long)pvVar6) & 0xfffffffffffffff8U) + 8);
      }
      lVar40 = lVar40 + 0x18;
    } while ((__new_size & 0xffffffff) * 0x18 != lVar40);
    if (-1 < iVar2) {
      pvVar18 = (this_02->
                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar17 = 0;
      do {
        *(double *)
         (*(long *)(*(long *)&(pvVar18->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data + lVar39 * 0x18) + lVar27 * 8) =
             pdVar8[(long)iVar21 + uVar17];
        uVar17 = uVar17 + 1;
        pvVar18 = pvVar18 + 1;
      } while ((__new_size & 0xffffffff) != uVar17);
    }
  }
  if (0 < iVar20) {
    pvVar19 = (this_01->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    sVar31 = 0;
    do {
      *(double *)
       (*(long *)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data + lVar39 * 8) = pdVar8[(long)iVar21 + __new_size + sVar31]
      ;
      sVar31 = sVar31 + 1;
      pvVar19 = pvVar19 + 1;
    } while (__new_size_00 != sVar31);
  }
  if (0 < (int)uVar36) {
    pvVar19 = (this->window_coefficients_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (this->buffer_).stored_dynamic_mean_vectors.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (this->buffer_).pi.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar20 = -uVar5;
    pvVar11 = (this->buffer_).stored_dynamic_diagonal_covariance_matrices.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (this->buffer_).k.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar13 = (this->buffer_).c.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar40 = (long)iVar20;
    uVar17 = __new_size & 0xffffffff;
    lVar39 = lVar40 * 8 + (long)(int)uVar5 * 8;
    lVar26 = (long)(int)uVar5 * 8;
    local_c0 = 0;
    do {
      if (-1 < iVar2) {
        lVar14 = *(long *)&pvVar19[local_c0].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        iVar21 = (int)((ulong)((long)*(pointer *)
                                      ((long)&pvVar19[local_c0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data + 8) - lVar14) >> 3);
        iVar16 = (iVar21 - (iVar21 + -1 >> 0x1f)) + -1 >> 1;
        iVar22 = -iVar16;
        iVar34 = iVar22;
        if (iVar16 != iVar22 && SBORROW4(iVar16,iVar22) == iVar16 * 2 < 0) {
          iVar34 = iVar16;
        }
        iVar34 = iVar16 + iVar34 + 1;
        iVar35 = iVar4 - iVar16;
        uVar24 = 0;
        do {
          if (-1 < iVar21) {
            iVar28 = iVar34;
            iVar23 = iVar35;
            do {
              dVar43 = *(double *)
                        (*(long *)(*(long *)&(this_02->
                                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar24].
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data +
                                  (long)(iVar23 % iVar3) * 0x18) + lVar27 * 8);
              if ((dVar43 == 1.79769313486232e+308) && (!NAN(dVar43))) goto LAB_00109c98;
              iVar23 = iVar23 + 1;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar17);
        if (-1 < iVar2) {
          uVar24 = 0;
          do {
            if (iVar20 <= iVar25) {
              lVar15 = *(long *)&pvVar10[uVar24].super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data;
              pvVar18 = (this_02->
                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar37 = lVar40;
              lVar41 = lVar27 + lVar40 + (long)iVar16;
              do {
                if (iVar21 < 0) {
                  dVar43 = 0.0;
                }
                else {
                  dVar43 = 0.0;
                  lVar32 = 0;
                  lVar29 = lVar41;
                  do {
                    dVar43 = dVar43 + *(double *)(lVar14 + lVar32 * 8) *
                                      *(double *)
                                       (*(long *)(*(long *)&pvVar18[uVar24].
                                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                                 (long)((iVar35 + (int)lVar32) % iVar3) * 0x18) +
                                       lVar29 * 8);
                    lVar32 = lVar32 + 1;
                    lVar29 = lVar29 + -1;
                  } while (iVar34 != (int)lVar32);
                }
                *(double *)(lVar15 + lVar26 + lVar37 * 8) = dVar43;
                lVar37 = lVar37 + 1;
                lVar41 = lVar41 + 1;
              } while (iVar3 - uVar5 != (int)lVar37);
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar17);
          if (-1 < iVar2) {
            uVar24 = 0;
            do {
              lVar15 = *(long *)&pvVar10[uVar24].super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data;
              if (iVar21 < 0) {
                dVar43 = 0.0;
              }
              else {
                dVar43 = 0.0;
                lVar37 = 0;
                do {
                  dVar43 = dVar43 + *(double *)(lVar14 + lVar37 * 8) *
                                    *(double *)(lVar26 + lVar15 + (long)iVar16 * -8 + lVar37 * 8);
                  lVar37 = lVar37 + 1;
                } while (iVar34 != (int)lVar37);
              }
              if (iVar20 <= iVar25) {
                dVar1 = *(double *)
                         (*(long *)&pvVar11[local_c0 * __new_size + uVar24].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + (long)(iVar4 % iVar3) * 8);
                lVar37 = *(long *)&pvVar12[uVar24].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                lVar41 = 0;
                do {
                  *(double *)(lVar37 + lVar39 + lVar41 * 8) =
                       *(double *)(lVar15 + lVar39 + lVar41 * 8) * (1.0 / (dVar43 + dVar1));
                  lVar41 = lVar41 + 1;
                } while (iVar3 != (int)lVar41);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar17);
            if (-1 < iVar2) {
              pvVar18 = (this_02->
                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_b0 = 0;
              do {
                if (iVar20 <= iVar25) {
                  lVar15 = *(long *)&pvVar10[local_b0].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  lVar37 = *(long *)&pvVar12[local_b0].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  lVar41 = *(long *)&pvVar18[local_b0].
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data;
                  lVar29 = lVar27 * 8 + lVar40 * -8;
                  lVar32 = -lVar40;
                  lVar38 = lVar40;
                  local_120 = lVar27 + lVar40;
                  do {
                    lVar30 = (long)iVar22;
                    if (iVar22 < lVar38) {
                      lVar30 = lVar38;
                    }
                    iVar28 = (int)lVar38;
                    iVar16 = iVar22;
                    if (iVar22 < iVar28) {
                      iVar16 = iVar28;
                    }
                    if (iVar16 <= iVar25) {
                      lVar42 = local_120 - lVar30;
                      lVar30 = lVar30 + -1;
                      lVar33 = *(long *)(lVar41 + (long)((iVar4 + iVar28) % iVar3) * 0x18) + lVar29;
                      do {
                        dVar43 = *(double *)(lVar33 + 8 + lVar30 * 8) -
                                 *(double *)(lVar37 + lVar26 + 8 + lVar30 * 8) *
                                 *(double *)(lVar15 + lVar26 + lVar38 * 8);
                        *(double *)(lVar33 + 8 + lVar30 * 8) = dVar43;
                        if (lVar32 + lVar30 != -1) {
                          *(double *)
                           (*(long *)(lVar41 + (long)((iVar4 + (int)lVar30 + 1) % iVar3) * 0x18) +
                           lVar42 * 8) = dVar43;
                        }
                        lVar30 = lVar30 + 1;
                        lVar42 = lVar42 + -1;
                      } while (lVar30 < iVar25);
                    }
                    lVar38 = lVar38 + 1;
                    lVar32 = lVar32 + -1;
                    lVar29 = lVar29 + -8;
                    local_120 = local_120 + 1;
                  } while (iVar3 - uVar5 != (int)lVar38);
                }
                local_b0 = local_b0 + 1;
              } while (local_b0 != uVar17);
              if (-1 < iVar2) {
                uVar24 = 0;
                do {
                  lVar15 = *(long *)&pvVar13[uVar24].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  dVar43 = *(double *)
                            (*(long *)&pvVar9[local_c0 * __new_size + uVar24].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + (long)(iVar4 % iVar3) * 8);
                  if (-1 < iVar21) {
                    lVar37 = 0;
                    do {
                      dVar43 = dVar43 - *(double *)(lVar14 + lVar37 * 8) *
                                        *(double *)
                                         (lVar15 + (long)((iVar35 + (int)lVar37) % iVar3) * 8);
                      lVar37 = lVar37 + 1;
                    } while (iVar34 != (int)lVar37);
                  }
                  if (iVar20 <= iVar25) {
                    lVar37 = *(long *)&pvVar12[uVar24].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data;
                    lVar41 = 0;
                    do {
                      lVar29 = (long)((int)((iVar4 - uVar5) + (int)lVar41) % iVar3);
                      *(double *)(lVar15 + lVar29 * 8) =
                           *(double *)(lVar37 + lVar39 + lVar41 * 8) * dVar43 +
                           *(double *)(lVar15 + lVar29 * 8);
                      lVar41 = lVar41 + 1;
                    } while (iVar3 != (int)lVar41);
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar17);
              }
            }
          }
        }
      }
LAB_00109c98:
      local_c0 = local_c0 + 1;
    } while (local_c0 != (uVar36 & 0x7fffffff));
  }
  this->current_frame_ = iVar4 + 1;
  return;
}

Assistant:

void RecursiveMaximumLikelihoodParameterGeneration::Forward() {
  const int num_delta(static_cast<int>(window_coefficients_.size()));
  const int static_size(num_order_ + 1);
  const int dynamic_size(static_size * num_delta);

  // Prepare memories.
  {
    if (buffer_.stored_dynamic_mean_vectors.size() !=
        static_cast<std::size_t>(dynamic_size)) {
      buffer_.stored_dynamic_mean_vectors.resize(dynamic_size);
      for (int m(0); m < dynamic_size; ++m) {
        buffer_.stored_dynamic_mean_vectors[m].resize(calculation_field_);
      }
    }

    if (buffer_.stored_dynamic_diagonal_covariance_matrices.size() !=
        static_cast<std::size_t>(dynamic_size)) {
      buffer_.stored_dynamic_diagonal_covariance_matrices.resize(dynamic_size);
      for (int m(0); m < dynamic_size; ++m) {
        buffer_.stored_dynamic_diagonal_covariance_matrices[m].resize(
            calculation_field_);
      }
    }

    if (buffer_.pi.size() != static_cast<std::size_t>(static_size)) {
      buffer_.pi.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.pi[m].resize(calculation_field_);
      }
    }

    if (buffer_.k.size() != static_cast<std::size_t>(static_size)) {
      buffer_.k.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.k[m].resize(calculation_field_);
      }
    }

    if (buffer_.p.size() != static_cast<std::size_t>(static_size)) {
      buffer_.p.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.p[m].resize(calculation_field_);
        for (int u(0); u < calculation_field_; ++u) {
          buffer_.p[m][u].resize(2 * calculation_field_ + 1);
          std::fill(buffer_.p[m][u].begin(), buffer_.p[m][u].end(), 0.0);
          buffer_.p[m][u][calculation_field_] = kInf;
        }
      }
    }

    if (buffer_.c.size() != static_cast<std::size_t>(static_size)) {
      buffer_.c.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.c[m].resize(calculation_field_);
        std::fill(buffer_.c[m].begin(), buffer_.c[m].end(), 0.0);
      }
    }
  }

  // Copy inputs.
  const int max_half_window_width(calculation_field_ - num_past_frame_ - 1);
  {
    const int t((current_frame_ + max_half_window_width) % calculation_field_);

    const double* static_and_dynamic_mean_vector(
        &(buffer_.static_and_dynamic_parameters[0]));
    for (int m(0); m < static_size; ++m) {
      buffer_.c[m][t] = static_and_dynamic_mean_vector[m];
    }
    for (int m(0); m < dynamic_size; ++m) {
      buffer_.stored_dynamic_mean_vectors[m][t] =
          static_and_dynamic_mean_vector[static_size + m];
    }

    const double* static_and_dynamic_diagonal_covariance_matrix(
        &(buffer_.static_and_dynamic_parameters[static_size + dynamic_size]));
    for (int m(0); m < static_size; ++m) {
      std::fill(buffer_.p[m][t].begin(), buffer_.p[m][t].end(), 0.0);
    }
    for (int m(0); m < static_size; ++m) {
      buffer_.p[m][t][calculation_field_] =
          static_and_dynamic_diagonal_covariance_matrix[m];
    }
    for (int m(0); m < dynamic_size; ++m) {
      buffer_.stored_dynamic_diagonal_covariance_matrices[m][t] =
          static_and_dynamic_diagonal_covariance_matrix[static_size + m];
    }
  }

  for (int d(0); d < num_delta; ++d) {
    const int half_window_width(
        (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
    const double* window_coefficients(
        &(window_coefficients_[d][half_window_width]));

    // Do not update state if given variance is infinite.
    bool update(true);
    for (int m(0); m < static_size; ++m) {
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        if (kInf == buffer_.p[m][(current_frame_ + j) % calculation_field_]
                             [calculation_field_]) {
          update = false;
          break;
        }
      }
      if (!update) break;
    }
    if (!update) continue;

    // Calculate the numerator of Kalman gain.
    for (int m(0); m < static_size; ++m) {
      double* pi(&buffer_.pi[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        double tmp(0.0);
        for (int j(-half_window_width); j <= half_window_width; ++j) {
          const double* p(
              &buffer_.p[m][(current_frame_ + j) % calculation_field_]
                        [calculation_field_]);
          tmp += window_coefficients[j] * p[u - j];
        }
        pi[u] = tmp;
      }
    }

    // Calculate Kalman gain.
    for (int m(0); m < static_size; ++m) {
      const double* pi(&buffer_.pi[m][num_past_frame_]);
      double tmp(0.0);
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        tmp += window_coefficients[j] * pi[j];
      }

      const double denominator(
          1.0 /
          (tmp +
           buffer_.stored_dynamic_diagonal_covariance_matrices
               [static_size * d + m][current_frame_ % calculation_field_]));
      double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        k[u] = pi[u] * denominator;
      }
    }

    // Update error covariance.
    for (int m(0); m < static_size; ++m) {
      const double* pi(&buffer_.pi[m][num_past_frame_]);
      const double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        double* pu(&buffer_.p[m][(current_frame_ + u) % calculation_field_]
                             [calculation_field_]);
        for (int v(std::max(u, -half_window_width)); v <= max_half_window_width;
             ++v) {
          pu[v - u] -= k[v] * pi[u];
          if (v != u) {
            double* pv(&buffer_.p[m][(current_frame_ + v) % calculation_field_]
                                 [calculation_field_]);
            pv[u - v] = pu[v - u];
          }
        }
      }
    }

    // Update state estimates.
    for (int m(0); m < static_size; ++m) {
      double* c(&buffer_.c[m][0]);
      double tmp(buffer_.stored_dynamic_mean_vectors[static_size * d + m]
                                                    [current_frame_ %
                                                     calculation_field_]);
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        tmp -= window_coefficients[j] *
               c[(current_frame_ + j) % calculation_field_];
      }

      const double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        c[(current_frame_ + u) % calculation_field_] += k[u] * tmp;
      }
    }
  }

  ++current_frame_;
}